

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  ExtensionInfo *pEVar1;
  undefined8 *in_RDX;
  ExtensionInfo *extension;
  undefined4 in_stack_00000010;
  
  pEVar1 = anon_unknown_19::FindRegisteredExtension
                     ((MessageLite *)CONCAT44(number,in_stack_00000010),output._4_4_);
  if (pEVar1 != (ExtensionInfo *)0x0) {
    *in_RDX = *(undefined8 *)pEVar1;
    in_RDX[1] = (pEVar1->field_3).enum_validity_check.func;
    in_RDX[2] = (pEVar1->field_3).enum_validity_check.arg;
    in_RDX[3] = pEVar1->descriptor;
  }
  return pEVar1 != (ExtensionInfo *)0x0;
}

Assistant:

bool GeneratedExtensionFinder::Find(int number, ExtensionInfo* output) {
  const ExtensionInfo* extension =
      FindRegisteredExtension(containing_type_, number);
  if (extension == NULL) {
    return false;
  } else {
    *output = *extension;
    return true;
  }
}